

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O3

int Dss_ManOperation(Dss_Man_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  Vec_Int_t *vFaninLits;
  Dss_Obj_t *pDVar9;
  int iVar10;
  Vec_Ptr_t *pVVar11;
  Dss_Obj_t *pDVar12;
  ulong uVar13;
  uint uVar14;
  Dss_Obj_t *pDVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  Dss_Obj_t *pChildren [12];
  int pBegEnd [12];
  Dss_Obj_t *local_c8 [12];
  uint local_68 [14];
  
  uVar8 = (ulong)(uint)nLits;
  if (pPerm != (uchar *)0x0 && Type != 3) {
    __assert_fail("Type == DAU_DSD_AND || pPerm == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                  ,0x50d,
                  "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
  }
  if (pPerm == (uchar *)0x0 || Type != 3) {
    if (Type == 3) {
      uVar16 = 0;
      pVVar11 = p->vObjs;
      uVar6 = 0;
      if (0 < nLits) {
        uVar7 = 0;
        uVar6 = 0;
        do {
          uVar5 = pLits[uVar7];
          if ((int)uVar5 < 0) goto LAB_004ceed5;
          uVar14 = pVVar11->nSize;
          if ((int)uVar14 <= (int)(uVar5 >> 1)) goto LAB_004ceeb6;
          ppvVar2 = pVVar11->pArray;
          pDVar9 = (Dss_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)ppvVar2[uVar5 >> 1]);
          if ((((ulong)pDVar9 & 1) == 0) && (uVar5 = *(uint *)&pDVar9->field_0x4, (uVar5 & 7) == 3))
          {
            if (0x7ffffff < uVar5) {
              uVar5 = uVar5 >> 0x1b;
              uVar13 = 0;
              do {
                uVar1 = (&pDVar9[1].Id)[uVar13];
                if ((int)uVar1 < 0) goto LAB_004ceed5;
                if (uVar14 <= uVar1 >> 1) goto LAB_004ceeb6;
                pvVar3 = ppvVar2[uVar1 >> 1];
                if (pvVar3 == (void *)(ulong)(uVar1 & 1)) {
                  uVar5 = (uint)uVar13;
                  break;
                }
                local_c8[(long)(int)uVar6 + uVar13] =
                     (Dss_Obj_t *)((ulong)pvVar3 ^ (ulong)(uVar1 & 1));
                uVar13 = uVar13 + 1;
              } while (uVar5 != uVar13);
              uVar6 = uVar5 + uVar6;
            }
          }
          else {
            lVar17 = (long)(int)uVar6;
            uVar6 = uVar6 + 1;
            local_c8[lVar17] = pDVar9;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
      }
      Dss_ObjSort(pVVar11,local_c8,uVar6,(int *)0x0);
      nLits = uVar6;
    }
    else if (Type == 4) {
      if (nLits < 1) {
        pVVar11 = p->vObjs;
        nLits = 0;
        uVar16 = 0;
      }
      else {
        uVar7 = (ulong)(uint)nLits;
        uVar8 = 0;
        uVar16 = 0;
        nLits = 0;
        do {
          uVar6 = pLits[uVar8];
          if ((int)uVar6 < 0) goto LAB_004cef13;
          pVVar11 = p->vObjs;
          uVar5 = pVVar11->nSize;
          if ((int)uVar5 <= (int)(uVar6 >> 1)) goto LAB_004ceeb6;
          ppvVar2 = pVVar11->pArray;
          pDVar9 = (Dss_Obj_t *)ppvVar2[uVar6 >> 1];
          uVar14 = *(uint *)&pDVar9->field_0x4;
          if ((uVar14 & 7) == 4) {
            if (0x7ffffff < uVar14) {
              uVar14 = uVar14 >> 0x1b;
              uVar13 = 0;
              do {
                uVar1 = (&pDVar9[1].Id)[uVar13];
                if ((int)uVar1 < 0) goto LAB_004ceed5;
                if (uVar5 <= uVar1 >> 1) goto LAB_004ceeb6;
                pvVar3 = ppvVar2[uVar1 >> 1];
                if (pvVar3 == (void *)(ulong)(uVar1 & 1)) {
                  uVar14 = (uint)uVar13;
                  break;
                }
                pDVar12 = (Dss_Obj_t *)((ulong)pvVar3 ^ (ulong)(uVar1 & 1));
                if (((ulong)pDVar12 & 1) != 0) {
                  __assert_fail("!Dss_IsComplement(pChild)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                                ,0x548,
                                "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)"
                               );
                }
                local_c8[(long)nLits + uVar13] = pDVar12;
                uVar13 = uVar13 + 1;
              } while (uVar14 != uVar13);
              nLits = uVar14 + nLits;
            }
          }
          else {
            lVar17 = (long)nLits;
            nLits = nLits + 1;
            local_c8[lVar17] = pDVar9;
          }
          uVar16 = uVar16 ^ uVar6 & 1;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar7);
      }
      Dss_ObjSort(pVVar11,local_c8,nLits,(int *)0x0);
    }
    else {
      if (Type != 5) {
        if (Type != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                        ,0x563,
                        "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)"
                       );
        }
        if (nLits < 1) {
          uVar16 = 0;
LAB_004cee86:
          vFaninLits = p->vLeaves;
          vFaninLits->nSize = 0;
          goto LAB_004cecab;
        }
        pVVar11 = p->vObjs;
        uVar8 = 0;
        do {
          uVar16 = pLits[uVar8];
          if ((int)uVar16 < 0) goto LAB_004ceed5;
          if (pVVar11->nSize <= (int)(uVar16 >> 1)) goto LAB_004ceeb6;
          local_c8[uVar8] = (Dss_Obj_t *)((ulong)(uVar16 & 1) ^ (ulong)pVVar11->pArray[uVar16 >> 1])
          ;
          uVar8 = uVar8 + 1;
        } while ((uint)nLits != uVar8);
        goto LAB_004cec5a;
      }
      uVar16 = *pLits;
      if ((int)uVar16 < 0) {
LAB_004cef13:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      if ((uVar16 & 1) == 0) {
        uVar6 = pLits[1];
      }
      else {
        *pLits = uVar16 & 0x7ffffffe;
        iVar10 = pLits[1];
        uVar6 = pLits[2];
        pLits[1] = uVar6;
        pLits[2] = iVar10;
      }
      if ((int)uVar6 < 0) goto LAB_004cef13;
      uVar16 = 0;
      if ((uVar6 & 1) != 0) {
        pLits[1] = uVar6 & 0x7ffffffe;
        if (pLits[2] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf4,"int Abc_LitNot(int)");
        }
        pLits[2] = pLits[2] ^ 1;
        uVar16 = 1;
      }
      if (nLits < 1) goto LAB_004cee86;
      pVVar11 = p->vObjs;
      uVar8 = 0;
      do {
        uVar6 = pLits[uVar8];
        if ((int)uVar6 < 0) goto LAB_004ceed5;
        if (pVVar11->nSize <= (int)(uVar6 >> 1)) goto LAB_004ceeb6;
        local_c8[uVar8] = (Dss_Obj_t *)((ulong)(uVar6 & 1) ^ (ulong)pVVar11->pArray[uVar6 >> 1]);
        uVar8 = uVar8 + 1;
      } while ((uint)nLits != uVar8);
    }
  }
  else {
    pVVar11 = p->vObjs;
    if (nLits < 1) {
      nLits = 0;
      Dss_ObjSort(pVVar11,local_c8,0,(int *)local_68);
    }
    else {
      uVar7 = 0;
      uVar16 = 0;
      uVar13 = 0;
      do {
        uVar6 = pLits[uVar7];
        if ((int)uVar6 < 0) {
LAB_004ceed5:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar5 = pVVar11->nSize;
        if ((int)uVar5 <= (int)(uVar6 >> 1)) {
LAB_004ceeb6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar2 = pVVar11->pArray;
        pvVar3 = ppvVar2[uVar6 >> 1];
        pDVar9 = (Dss_Obj_t *)((ulong)(uVar6 & 1) ^ (ulong)pvVar3);
        iVar10 = (int)uVar13;
        if (((ulong)pDVar9 & 1) == 0) {
          uVar6 = *(uint *)&pDVar9->field_0x4;
          if ((uVar6 & 7) != 3) {
            uVar6 = 0;
            goto LAB_004cea18;
          }
          if (0x7ffffff < uVar6) {
            lVar17 = (long)iVar10;
            uVar13 = 0;
            do {
              uVar14 = (&pDVar9[1].Id)[uVar13];
              if ((int)uVar14 < 0) goto LAB_004ceed5;
              if (uVar5 <= uVar14 >> 1) goto LAB_004ceeb6;
              pvVar3 = ppvVar2[uVar14 >> 1];
              if (pvVar3 == (void *)(ulong)(uVar14 & 1)) break;
              pDVar15 = (Dss_Obj_t *)((ulong)(uVar14 & 1) ^ (ulong)pvVar3);
              bVar4 = (*(uint *)&((Dss_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe))->field_0x4 & 7)
                      == 2 & (byte)pDVar15;
              pDVar12 = (Dss_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe);
              if (bVar4 == 0) {
                pDVar12 = pDVar15;
              }
              uVar14 = uVar16 << 0x10;
              uVar16 = uVar16 + (*(uint *)(((ulong)pDVar12 & 0xfffffffffffffffe) + 4) >> 3 & 0xff);
              local_68[lVar17 + uVar13] = uVar14 | (uint)bVar4 << 8 | uVar16;
              local_c8[lVar17 + uVar13] = pDVar12;
              uVar13 = uVar13 + 1;
            } while (uVar13 < uVar6 >> 0x1b);
            uVar13 = lVar17 + uVar13;
          }
        }
        else {
          pDVar12 = (Dss_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe);
          bVar18 = (*(uint *)&pDVar12->field_0x4 & 7) == 2;
          if (bVar18) {
            pDVar9 = pDVar12;
          }
          uVar6 = (uint)bVar18 << 8;
LAB_004cea18:
          uVar5 = uVar16 << 0x10;
          uVar16 = uVar16 + (*(uint *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4) >> 3 & 0xff);
          local_68[iVar10] = uVar5 | uVar6 | uVar16;
          uVar13 = (ulong)(iVar10 + 1);
          local_c8[iVar10] = pDVar9;
        }
        nLits = (int)uVar13;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar8);
      Dss_ObjSort(pVVar11,local_c8,nLits,(int *)local_68);
      if (nLits < 1) {
        uVar6 = 0;
      }
      else {
        uVar8 = 0;
        uVar6 = 0;
        do {
          uVar5 = local_68[uVar8];
          iVar10 = (int)uVar5 >> 0x10;
          if (iVar10 < (int)(uVar5 & 0xff)) {
            bVar4 = (byte)(uVar5 >> 8) & 1 | (char)(uVar5 >> 0x10) * '\x02';
            lVar17 = 0;
            do {
              if (iVar10 < 0) goto LAB_004cee97;
              pPerm[lVar17 + (int)uVar6] = bVar4;
              lVar17 = lVar17 + 1;
              bVar4 = bVar4 + 2;
            } while ((uVar5 & 0xff) - iVar10 != (int)lVar17);
            uVar6 = uVar6 + (int)lVar17;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uVar13 & 0xffffffff));
      }
      if (uVar6 != uVar16) {
        __assert_fail("j == nSSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                      ,0x52e,
                      "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)")
        ;
      }
    }
LAB_004cec5a:
    uVar16 = 0;
  }
  vFaninLits = p->vLeaves;
  vFaninLits->nSize = 0;
  if (0 < nLits) {
    uVar8 = 0;
    do {
      iVar10 = *(int *)((ulong)local_c8[uVar8] & 0xfffffffffffffffe);
      if (iVar10 < 0) goto LAB_004cee97;
      Vec_IntPush(p->vLeaves,((uint)local_c8[uVar8] & 1) + iVar10 * 2);
      uVar8 = uVar8 + 1;
    } while ((uint)nLits != uVar8);
    vFaninLits = p->vLeaves;
  }
LAB_004cecab:
  pDVar9 = Dss_ObjFindOrAdd(p,Type,vFaninLits,pTruth);
  if (-1 < (int)pDVar9->Id) {
    return uVar16 + pDVar9->Id * 2;
  }
LAB_004cee97:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf1,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Dss_ManOperation( Dss_Man_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nChildren = 0, fCompl = 0, fComplFan;

    assert( Type == DAU_DSD_AND || pPerm == NULL );
    if ( Type == DAU_DSD_AND && pPerm != NULL )
    {
        int pBegEnd[DAU_MAX_VAR];
        int j, nSSize = 0;
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
            {
                fComplFan = (Dss_Regular(pObj)->Type == DAU_DSD_VAR && Dss_IsComplement(pObj));
                if ( fComplFan )
                    pObj = Dss_Regular(pObj);
                pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pObj)->nSupp);
                nSSize += Dss_Regular(pObj)->nSupp;
                pChildren[nChildren++] = pObj;
            }
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    fComplFan = (Dss_Regular(pChild)->Type == DAU_DSD_VAR && Dss_IsComplement(pChild));
                    if ( fComplFan )
                        pChild = Dss_Regular(pChild);
                    pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pChild)->nSupp);
                    nSSize += Dss_Regular(pChild)->nSupp;
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPerm[j++] = (unsigned char)Abc_Var2Lit( k, (pBegEnd[i] >> 8) & 1 );
        assert( j == nSSize );
    }
    else if ( Type == DAU_DSD_AND )
    {
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                    pChildren[nChildren++] = pChild;
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            fCompl ^= Abc_LitIsCompl(pLits[k]);
            pObj = Dss_Lit2Obj(p->vObjs, Abc_LitRegular(pLits[k]));
            if ( pObj->Type != DAU_DSD_XOR )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    assert( !Dss_IsComplement(pChild) );
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_MUX )
    {
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else if ( Type == DAU_DSD_PRIME )
    {
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else assert( 0 );

    // shift subgraphs
    Vec_IntClear( p->vLeaves );
    for ( i = 0; i < nChildren; i++ )
        Vec_IntPush( p->vLeaves, Dss_Obj2Lit(pChildren[i]) );
    // create new graph
    pObj = Dss_ObjFindOrAdd( p, Type, p->vLeaves, pTruth );
    return Abc_Var2Lit( pObj->Id, fCompl );
}